

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O0

void test_3(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChStreamOutAscii *pCVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  ChVector<double> *pCVar10;
  ChVector<double> local_8e8;
  ChVector<double> local_8d0;
  shared_ptr<chrono::ChSolver> local_8b8;
  undefined1 local_8a8 [8];
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::ChPhysicsItem> local_888;
  shared_ptr<chrono::ChPhysicsItem> local_878;
  shared_ptr<chrono::ChBodyFrame> local_868;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_858;
  shared_ptr<chrono::ChBodyFrame> local_848;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_838;
  shared_ptr<chrono::ChBodyFrame> local_828;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_818;
  undefined1 local_808 [8];
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  undefined1 local_7c8 [8];
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChElementBase> local_7a8;
  shared_ptr<chrono::fea::ChContinuumElastic> local_798;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_788;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_778;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_768;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_758;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_748;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_738;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_728;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_718;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_708;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_6f8;
  undefined1 local_6e8 [8];
  shared_ptr<chrono::fea::ChElementTetraCorot_10> melement1;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_6c8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_6b8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_6a8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_698;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_688;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_678;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_668;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_658;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_648;
  ChVector<double> local_638;
  ChVector<double> local_620;
  ChVector<double> local_608;
  undefined1 local_5f0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode10;
  ChVector<double> local_5c8;
  undefined1 local_5b0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode9;
  ChVector<double> local_588;
  undefined1 local_570 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode8;
  ChVector<double> local_548;
  undefined1 local_530 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode7;
  ChVector<double> local_508;
  undefined1 local_4f0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode6;
  ChVector<double> local_4c8;
  undefined1 local_4b0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode5;
  undefined1 local_488 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  undefined1 local_460 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  undefined1 local_438 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  undefined1 local_410 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  undefined1 local_3e0 [8];
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  ChSystemSMC sys;
  
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar2,"\n-------------------------------------------------\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"TEST: QUADRATIC tetrahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,true);
  chrono_types::make_shared<chrono::fea::ChMesh,_0>();
  chrono_types::make_shared<chrono::fea::ChContinuumElastic,_0>();
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  chrono::fea::ChContinuumElastic::Set_E(207000000000.0);
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_410);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.001,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_438);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.001,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_460);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,0.001);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_488);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_410);
  peVar4 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_438);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)(peVar3 + 0x20),(ChVector<double> *)(peVar4 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_4c8,
             (ChVector<double> *)
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_4b0);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_438);
  peVar4 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_460);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)(peVar3 + 0x20),(ChVector<double> *)(peVar4 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_508,
             (ChVector<double> *)
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_4f0);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_460);
  peVar4 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_410);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)(peVar3 + 0x20),(ChVector<double> *)(peVar4 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_548,
             (ChVector<double> *)
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_530);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_410);
  peVar4 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_488);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)(peVar3 + 0x20),(ChVector<double> *)(peVar4 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_588,
             (ChVector<double> *)
             &mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_570);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_488);
  peVar4 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_438);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)(peVar3 + 0x20),(ChVector<double> *)(peVar4 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_5c8,
             (ChVector<double> *)
             &mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_5b0);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_460);
  peVar4 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_488);
  chrono::ChVector<double>::operator+
            (&local_620,(ChVector<double> *)(peVar3 + 0x20),(ChVector<double> *)(peVar4 + 0x20));
  chrono::ChVector<double>::operator*(&local_608,&local_620,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_5f0);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_460);
  chrono::ChVector<double>::ChVector(&local_638,0.0,-1000.0,0.0);
  (**(code **)(*(long *)peVar3 + 0x68))(peVar3,&local_638);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_648,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_410);
  chrono::fea::ChMesh::AddNode(peVar5,&local_648);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_648);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_658,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_438);
  chrono::fea::ChMesh::AddNode(peVar5,&local_658);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_658);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_668,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_460);
  chrono::fea::ChMesh::AddNode(peVar5,&local_668);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_668);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_678,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_488);
  chrono::fea::ChMesh::AddNode(peVar5,&local_678);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_678);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_688,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4b0);
  chrono::fea::ChMesh::AddNode(peVar5,&local_688);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_688);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_698,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4f0);
  chrono::fea::ChMesh::AddNode(peVar5,&local_698);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_698);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_6a8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_530);
  chrono::fea::ChMesh::AddNode(peVar5,&local_6a8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_6a8);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_6b8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_570);
  chrono::fea::ChMesh::AddNode(peVar5,&local_6b8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_6b8);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_6c8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5b0);
  chrono::fea::ChMesh::AddNode(peVar5,&local_6c8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_6c8);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  p_Var1 = &melement1.
            super___shared_ptr<chrono::fea::ChElementTetraCorot_10,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)p_Var1,
             (shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5f0);
  chrono::fea::ChMesh::AddNode(peVar5,p_Var1);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)
             &melement1.
              super___shared_ptr<chrono::fea::ChElementTetraCorot_10,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::fea::ChElementTetraCorot_10,_0>();
  peVar6 = std::
           __shared_ptr_access<chrono::fea::ChElementTetraCorot_10,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementTetraCorot_10,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_6e8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_6f8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_410);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_708,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_438);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_718,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_460);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_728,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_488);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_738,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_748,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4f0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_758,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_530);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_768,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_570);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_778,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_788,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5f0);
  (**(code **)(*(long *)peVar6 + 0x38))
            (peVar6,&local_6f8,&local_708,&local_718,&local_728,&local_738,&local_748,&local_758,
             &local_768,&local_778,&local_788);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_788);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_778);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_768);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_758);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_748);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_738);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_728);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_718);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_708);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_6f8);
  peVar6 = std::
           __shared_ptr_access<chrono::fea::ChElementTetraCorot_10,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementTetraCorot_10,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_6e8);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::shared_ptr
            (&local_798,
             (shared_ptr<chrono::fea::ChContinuumElastic> *)
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::fea::ChElementTetraCorot_10::SetMaterial(peVar6,&local_798);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr(&local_798);
  peVar5 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::shared_ptr<chrono::fea::ChElementBase>::shared_ptr<chrono::fea::ChElementTetraCorot_10,void>
            (&local_7a8,(shared_ptr<chrono::fea::ChElementTetraCorot_10> *)local_6e8);
  chrono::fea::ChMesh::AddElement(peVar5,&local_7a8);
  std::shared_ptr<chrono::fea::ChElementBase>::~shared_ptr(&local_7a8);
  p_Var1 = &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChMesh,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChMesh> *)local_3e0);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono_types::make_shared<chrono::ChBody,_0>();
  p_Var1 = &constraint1.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBody,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,(shared_ptr<chrono::ChBody> *)local_7c8);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar7 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_7c8);
  chrono::ChBody::SetBodyFixed(SUB81(peVar7,0));
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  peVar8 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint2.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_818,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_410);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_828,(shared_ptr<chrono::ChBody> *)local_7c8);
  (**(code **)(*(long *)peVar8 + 0x220))(peVar8,&local_818,&local_828,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_828);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_818);
  peVar8 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint3.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_838,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_438);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_848,(shared_ptr<chrono::ChBody> *)local_7c8);
  (**(code **)(*(long *)peVar8 + 0x220))(peVar8,&local_838,&local_848,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_848);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_838);
  peVar8 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_808);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_858,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_488);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_868,(shared_ptr<chrono::ChBody> *)local_7c8);
  (**(code **)(*(long *)peVar8 + 0x220))(peVar8,&local_858,&local_868,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_868);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_858);
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (&local_878,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_878);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_878);
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (&local_888,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_888);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_888);
  p_Var1 = &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)local_808);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::ChSolverMINRES,_0>();
  std::shared_ptr<chrono::ChSolver>::shared_ptr<chrono::ChSolverMINRES,void>
            (&local_8b8,(shared_ptr<chrono::ChSolverMINRES> *)local_8a8);
  chrono::ChSystem::SetSolver
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_8b8);
  std::shared_ptr<chrono::ChSolver>::~shared_ptr(&local_8b8);
  peVar9 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_8a8);
  chrono::ChIterativeSolver::SetMaxIterations((ChIterativeSolver *)peVar9,100);
  peVar9 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_8a8);
  chrono::ChIterativeSolver::SetTolerance((ChIterativeSolver *)peVar9,1e-12);
  peVar9 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_8a8);
  chrono::ChIterativeSolver::EnableDiagonalPreconditioner((ChIterativeSolver *)peVar9,true);
  peVar9 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_8a8);
  chrono::ChSolver::SetVerbose((ChSolver *)(peVar9 + 0x18),true);
  chrono::ChSystem::DoStaticLinear();
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_410);
  pCVar10 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar10);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_438);
  pCVar10 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar10);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_460);
  pCVar10 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar10);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_488);
  pCVar10 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar10);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node3 displ: ");
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_460);
  pCVar10 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_460);
  (**(code **)(*(long *)peVar3 + 0x60))(&local_8e8);
  chrono::ChVector<double>::operator-(&local_8d0,pCVar10,&local_8e8);
  pCVar2 = chrono::operator<<(pCVar2,&local_8d0);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  std::shared_ptr<chrono::ChSolverMINRES>::~shared_ptr
            ((shared_ptr<chrono::ChSolverMINRES> *)local_8a8);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)local_808);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)local_7c8);
  std::shared_ptr<chrono::fea::ChElementTetraCorot_10>::~shared_ptr
            ((shared_ptr<chrono::fea::ChElementTetraCorot_10> *)local_6e8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5f0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_570);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_530);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4f0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_488);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_460);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_438);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_410);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr
            ((shared_ptr<chrono::fea::ChContinuumElastic> *)
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChMesh>::~shared_ptr((shared_ptr<chrono::fea::ChMesh> *)local_3e0);
  chrono::ChSystemSMC::~ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void test_3() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: QUADRATIC tetrahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(207e9);
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0.001, 0, 0));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0.001, 0));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0.001));
    auto mnode5 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode2->pos) * 0.5);  //  nodes at mid length of edges
    auto mnode6 = chrono_types::make_shared<ChNodeFEAxyz>((mnode2->pos + mnode3->pos) * 0.5);
    auto mnode7 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode1->pos) * 0.5);
    auto mnode8 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode4->pos) * 0.5);
    auto mnode9 = chrono_types::make_shared<ChNodeFEAxyz>((mnode4->pos + mnode2->pos) * 0.5);
    auto mnode10 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode4->pos) * 0.5);

    // For example, set an applied force to a node:
    mnode3->SetForce(ChVector<>(0, -1000, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);
    my_mesh->AddNode(mnode5);
    my_mesh->AddNode(mnode6);
    my_mesh->AddNode(mnode7);
    my_mesh->AddNode(mnode8);
    my_mesh->AddNode(mnode9);
    my_mesh->AddNode(mnode10);

    // Create the tetrahedron element, and assign
    // it nodes and material
    auto melement1 = chrono_types::make_shared<ChElementTetraCorot_10>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4, mnode5, mnode6, mnode7, mnode8, mnode9, mnode10);
    melement1->SetMaterial(mmaterial);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    sys.Add(truss);
    truss->SetBodyFixed(true);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,  // node 
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,  // node 
                            truss);   // body to be connected to

    constraint3->Initialize(mnode4,  // node 
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-12);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    // GetLog()<<melement1.GetStiffnessMatrix()<<"\n";
    // GetLog()<<melement1.GetMatrB()<<"\n";
    GetLog() << mnode1->GetPos() << "\n";
    GetLog() << mnode2->GetPos() << "\n";
    GetLog() << mnode3->GetPos() << "\n";
    GetLog() << mnode4->GetPos() << "\n";
    GetLog() << "node3 displ: " << mnode3->GetPos() - mnode3->GetX0() << "\n";
}